

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv_dh.c
# Opt level: O0

wchar_t isobusfs_check_current_dir_access(isobusfs_srv_priv *priv,char *path,size_t path_size)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  wchar_t ret;
  char linux_path [4096];
  undefined1 local_1028 [112];
  size_t in_stack_fffffffffffff048;
  char *in_stack_fffffffffffff050;
  size_t in_stack_fffffffffffff058;
  char *in_stack_fffffffffffff060;
  isobusfs_srv_priv *in_stack_fffffffffffff068;
  wchar_t local_4;
  
  local_4 = isobusfs_path_to_linux_path
                      (in_stack_fffffffffffff068,in_stack_fffffffffffff060,in_stack_fffffffffffff058
                       ,in_stack_fffffffffffff050,in_stack_fffffffffffff048);
  if (L'\xffffffff' < local_4) {
    isobusfs_log(4,"convert ISOBUS FS path to linux path: %.*s -> %s",in_RDX,in_RSI,local_1028);
    local_4 = isobusfs_cmn_dh_validate_dir_path(local_1028,0);
    if (L'\xffffffff' < local_4) {
      local_4 = L'\0';
    }
  }
  return local_4;
}

Assistant:

int isobusfs_check_current_dir_access(struct isobusfs_srv_priv *priv,
				      const char *path, size_t path_size)
{
	char linux_path[ISOBUSFS_SRV_MAX_PATH_LEN];
	int ret;

	ret = isobusfs_path_to_linux_path(priv, path, path_size,
					  linux_path, sizeof(linux_path));
	if (ret < 0)
		return ret;

	pr_debug("convert ISOBUS FS path to linux path: %.*s -> %s",
		 path_size, path, linux_path);

	ret = isobusfs_cmn_dh_validate_dir_path(linux_path, false);
	if (ret < 0)
		return ret;

	return 0;
}